

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

uint64_t __thiscall kratos::Context::get_hash(Context *this,Generator *generator)

{
  bool bVar1;
  mapped_type *pmVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  string_view format_str;
  format_args args;
  string local_b8;
  Generator *local_98;
  Generator *generator_local;
  Context *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = generator;
  generator_local = (Generator *)this;
  bVar1 = has_hash(this,generator);
  if (!bVar1) {
    auVar3 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_98->name;
    local_38 = &local_b8;
    local_40 = "{0}\'s hash has not been computed";
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string_const&,char[33],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"{0}\'s hash has not been computed",(v7 *)vargs,auVar3._8_8_,
                    (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                    "{0}\'s hash has not been computed");
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_78.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b8,(detail *)local_78.data_,format_str,args);
    std::runtime_error::runtime_error(auVar3._0_8_,(string *)&local_b8);
    __cxa_throw(auVar3._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::
           unordered_map<const_kratos::Generator_*,_unsigned_long,_std::hash<const_kratos::Generator_*>,_std::equal_to<const_kratos::Generator_*>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>_>
           ::at(&this->generator_hash_,&local_98);
  return *pmVar2;
}

Assistant:

uint64_t Context::get_hash(const Generator *generator) const {
    if (!has_hash(generator))
        throw ::runtime_error(::format("{0}'s hash has not been computed", generator->name));
    return generator_hash_.at(generator);
}